

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O3

void __thiscall btSoftBody::AJoint::Prepare(AJoint *this,btScalar dt,int iterations)

{
  Body *this_00;
  Body *this_01;
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  btTransform *pbVar5;
  btMatrix3x3 *pbVar6;
  btMatrix3x3 *pbVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined8 uVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  btMatrix3x3 r;
  undefined1 auStack_58 [4];
  btScalar local_54;
  float local_50;
  undefined8 local_4c;
  float local_40;
  undefined8 local_3c;
  float local_30;
  undefined8 local_2c;
  
  local_54 = dt;
  (**(code **)(*(long *)this->m_icontrol + 0x10))(this->m_icontrol,this);
  this_00 = (this->super_Joint).m_bodies;
  Body::activate(this_00);
  this_01 = (this->super_Joint).m_bodies + 1;
  Body::activate(this_01);
  pbVar5 = Body::xform(this_00);
  fVar10 = (this->super_Joint).m_refs[0].m_floats[0];
  fVar13 = (this->super_Joint).m_refs[0].m_floats[1];
  fVar12 = (this->super_Joint).m_refs[0].m_floats[2];
  auVar14._0_4_ =
       fVar12 * (pbVar5->m_basis).m_el[0].m_floats[2] +
       fVar10 * (pbVar5->m_basis).m_el[0].m_floats[0] +
       (pbVar5->m_basis).m_el[0].m_floats[1] * fVar13;
  auVar14._4_4_ =
       fVar12 * (pbVar5->m_basis).m_el[1].m_floats[2] +
       fVar10 * (pbVar5->m_basis).m_el[1].m_floats[0] +
       (pbVar5->m_basis).m_el[1].m_floats[1] * fVar13;
  auVar14._8_4_ =
       fVar12 * (pbVar5->m_basis).m_el[2].m_floats[2] +
       fVar10 * (pbVar5->m_basis).m_el[2].m_floats[0] +
       fVar13 * (pbVar5->m_basis).m_el[2].m_floats[1];
  auVar14._12_4_ = 0;
  *(undefined1 (*) [16])this->m_axis[0].m_floats = auVar14;
  pbVar5 = Body::xform(this_01);
  fVar10 = (this->super_Joint).m_refs[1].m_floats[0];
  fVar13 = (this->super_Joint).m_refs[1].m_floats[1];
  fVar12 = (this->super_Joint).m_refs[1].m_floats[2];
  fVar11 = (pbVar5->m_basis).m_el[0].m_floats[2] * fVar12 +
           (pbVar5->m_basis).m_el[0].m_floats[0] * fVar10 +
           (pbVar5->m_basis).m_el[0].m_floats[1] * fVar13;
  fVar24 = this->m_axis[0].m_floats[0];
  fVar22 = 0.0;
  fVar23 = 0.0;
  fVar9 = fVar12 * (pbVar5->m_basis).m_el[1].m_floats[2] +
          fVar10 * (pbVar5->m_basis).m_el[1].m_floats[0] +
          (pbVar5->m_basis).m_el[1].m_floats[1] * fVar13;
  fVar10 = fVar12 * (pbVar5->m_basis).m_el[2].m_floats[2] +
           fVar10 * (pbVar5->m_basis).m_el[2].m_floats[0] +
           (pbVar5->m_basis).m_el[2].m_floats[1] * fVar13;
  auVar15._4_4_ = fVar9;
  auVar15._0_4_ = fVar11;
  auVar15._8_4_ = fVar10;
  auVar15._12_4_ = 0;
  *(undefined1 (*) [16])this->m_axis[1].m_floats = auVar15;
  uVar20 = *(undefined8 *)(this->m_axis[0].m_floats + 1);
  fVar13 = (float)uVar20;
  fVar12 = (float)((ulong)uVar20 >> 0x20);
  fVar16 = fVar12 * fVar9 - fVar10 * fVar13;
  fVar17 = fVar24 * fVar10 - fVar11 * fVar12;
  fVar18 = fVar11 * fVar13 - fVar24 * fVar9;
  fVar21 = SQRT(fVar18 * fVar18 + fVar16 * fVar16 + fVar17 * fVar17);
  fVar19 = 0.0;
  if (1.1920929e-07 < fVar21) {
    fVar21 = 1.0 / fVar21;
    fVar19 = fVar18 * fVar21;
    fVar22 = fVar16 * fVar21;
    fVar23 = fVar17 * fVar21;
  }
  auVar4._4_4_ = fVar23;
  auVar4._0_4_ = fVar22;
  auVar4._8_4_ = fVar19;
  auVar4._12_4_ = 0;
  *(undefined1 (*) [16])(this->super_Joint).m_drift.m_floats = auVar4;
  fVar13 = fVar12 * fVar10 + fVar24 * fVar11 + fVar9 * fVar13;
  fVar10 = 1.0;
  if (fVar13 <= 1.0) {
    fVar10 = fVar13;
  }
  fVar10 = (float)(-(uint)(fVar13 < -1.0) & 0xbf800000 | ~-(uint)(fVar13 < -1.0) & (uint)fVar10);
  fVar13 = -1.0;
  if (-1.0 <= fVar10) {
    fVar13 = fVar10;
  }
  fVar13 = acosf(fVar13);
  fVar10 = 0.19634955;
  if (fVar13 <= 0.19634955) {
    fVar10 = fVar13;
  }
  fVar13 = (this->super_Joint).m_drift.m_floats[2];
  fVar12 = (this->super_Joint).m_erp / local_54;
  uVar20 = *(undefined8 *)(this->super_Joint).m_drift.m_floats;
  *(ulong *)(this->super_Joint).m_drift.m_floats =
       CONCAT44(fVar12 * fVar10 * (float)((ulong)uVar20 >> 0x20),fVar12 * fVar10 * (float)uVar20);
  (this->super_Joint).m_drift.m_floats[2] = fVar13 * fVar10 * fVar12;
  pbVar6 = Body::invWorldInertia(this_00);
  pbVar7 = Body::invWorldInertia(this_01);
  lVar8 = 8;
  do {
    uVar20 = *(undefined8 *)((long)pbVar6->m_el[0].m_floats + lVar8 + -8);
    uVar1 = *(undefined8 *)((long)pbVar7->m_el[0].m_floats + lVar8 + -8);
    auVar3._4_4_ = (float)((ulong)uVar1 >> 0x20) + (float)((ulong)uVar20 >> 0x20);
    auVar3._0_4_ = (float)uVar1 + (float)uVar20;
    auVar3._8_4_ = *(float *)((long)pbVar6->m_el[0].m_floats + lVar8) +
                   *(float *)((long)pbVar7->m_el[0].m_floats + lVar8);
    auVar3._12_4_ = 0;
    *(undefined1 (*) [16])(auStack_58 + lVar8) = auVar3;
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x38);
  fVar10 = (float)local_3c;
  fVar13 = (float)((ulong)local_3c >> 0x20);
  fVar22 = (float)local_2c;
  fVar17 = (float)((ulong)local_2c >> 0x20);
  fVar12 = (float)local_4c;
  fVar19 = (float)((ulong)local_4c >> 0x20);
  fVar23 = fVar10 * fVar17 - fVar22 * fVar13;
  fVar18 = fVar13 * local_30 - fVar17 * local_40;
  fVar16 = local_40 * fVar22 - local_30 * fVar10;
  fVar24 = 1.0 / (fVar19 * fVar16 + local_50 * fVar23 + fVar18 * fVar12);
  fVar16 = fVar16 * fVar24;
  fVar11 = (local_30 * fVar12 + -local_50 * fVar22) * fVar24;
  fVar9 = (local_50 * fVar10 - local_40 * fVar12) * fVar24;
  fVar23 = fVar23 * fVar24;
  fVar18 = fVar18 * fVar24;
  fVar22 = (fVar19 * fVar22 + -fVar12 * fVar17) * fVar24;
  fVar17 = (local_50 * fVar17 + -fVar19 * local_30) * fVar24;
  fVar12 = (fVar13 * fVar12 - fVar10 * fVar19) * fVar24;
  fVar24 = (local_40 * fVar19 - fVar13 * local_50) * fVar24;
  (this->super_Joint).m_massmatrix.m_el[0].m_floats[0] = fVar23;
  (this->super_Joint).m_massmatrix.m_el[0].m_floats[1] = fVar22;
  (this->super_Joint).m_massmatrix.m_el[0].m_floats[2] = fVar12;
  (this->super_Joint).m_massmatrix.m_el[0].m_floats[3] = 0.0;
  *(ulong *)(this->super_Joint).m_massmatrix.m_el[1].m_floats = CONCAT44(fVar17,fVar18);
  (this->super_Joint).m_massmatrix.m_el[1].m_floats[2] = fVar24;
  (this->super_Joint).m_massmatrix.m_el[1].m_floats[3] = 0.0;
  (this->super_Joint).m_massmatrix.m_el[2].m_floats[0] = fVar16;
  (this->super_Joint).m_massmatrix.m_el[2].m_floats[1] = fVar11;
  (this->super_Joint).m_massmatrix.m_el[2].m_floats[2] = fVar9;
  (this->super_Joint).m_massmatrix.m_el[2].m_floats[3] = 0.0;
  fVar10 = (this->super_Joint).m_split;
  uVar20 = *(undefined8 *)(this->super_Joint).m_drift.m_floats;
  fVar13 = (this->super_Joint).m_drift.m_floats[2];
  if (0.0 < fVar10) {
    fVar25 = fVar10 * (float)uVar20;
    fVar19 = (float)((ulong)uVar20 >> 0x20);
    fVar21 = fVar19 * fVar10;
    fVar26 = fVar10 * fVar13;
    auVar2._4_4_ = fVar24 * fVar26 + fVar18 * fVar25 + fVar21 * fVar17;
    auVar2._0_4_ = fVar12 * fVar26 + fVar23 * fVar25 + fVar21 * fVar22;
    auVar2._8_4_ = fVar21 * fVar11 + fVar16 * fVar25 + fVar9 * fVar26;
    auVar2._12_4_ = 0;
    *(undefined1 (*) [16])(this->super_Joint).m_sdrift.m_floats = auVar2;
    fVar10 = 1.0 - fVar10;
    fVar13 = fVar13 * fVar10;
    uVar20 = CONCAT44(fVar19 * fVar10,(float)uVar20 * fVar10);
    *(undefined8 *)(this->super_Joint).m_drift.m_floats = uVar20;
  }
  fVar10 = 1.0 / (float)iterations;
  *(ulong *)(this->super_Joint).m_drift.m_floats =
       CONCAT44(fVar10 * (float)((ulong)uVar20 >> 0x20),fVar10 * (float)uVar20);
  (this->super_Joint).m_drift.m_floats[2] = fVar10 * fVar13;
  return;
}

Assistant:

void				btSoftBody::AJoint::Prepare(btScalar dt,int iterations)
{
	static const btScalar	maxdrift=SIMD_PI/16;
	m_icontrol->Prepare(this);
	Joint::Prepare(dt,iterations);
	m_axis[0]	=	m_bodies[0].xform().getBasis()*m_refs[0];
	m_axis[1]	=	m_bodies[1].xform().getBasis()*m_refs[1];
	m_drift		=	NormalizeAny(btCross(m_axis[1],m_axis[0]));
	m_drift		*=	btMin(maxdrift,btAcos(Clamp<btScalar>(btDot(m_axis[0],m_axis[1]),-1,+1)));
	m_drift		*=	m_erp/dt;
	m_massmatrix=	AngularImpulseMatrix(m_bodies[0].invWorldInertia(),m_bodies[1].invWorldInertia());
	if(m_split>0)
	{
		m_sdrift	=	m_massmatrix*(m_drift*m_split);
		m_drift		*=	1-m_split;
	}
	m_drift	/=(btScalar)iterations;
}